

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

uint32_t __thiscall
absl::lts_20250127::synchronization_internal::anon_unknown_0::NodeSet::FindIndex
          (NodeSet *this,int32_t v)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = v * 0x29;
  uVar4 = 0;
  bVar2 = false;
  do {
    uVar3 = uVar3 & (this->table_).size_ - 1;
    iVar1 = (this->table_).ptr_[uVar3];
    if (iVar1 == v) {
      return uVar3;
    }
    if (iVar1 == -2) {
      if (!bVar2) {
        bVar2 = true;
        uVar4 = (ulong)uVar3;
      }
    }
    else if (iVar1 == -1) {
      if (!bVar2) {
        return uVar3;
      }
      return (uint32_t)uVar4;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

uint32_t size() const { return size_; }